

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O2

void __thiscall FBX::Stream::~Stream(Stream *this)

{
  munmap(this->data,this->fileSize);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Stream::~Stream() {
#if defined(__unix__) || defined(__APPLE__)
        munmap(data, fileSize);
#elif __WIN32__
        UnmapViewOfFile(data);
        CloseHandle(map);
        CloseHandle(file);
#endif
    }